

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O2

DirWatcherGeneric * __thiscall
efsw::DirWatcherGeneric::createDirectory(DirWatcherGeneric *this,string *newdir)

{
  WatcherGeneric *pWVar1;
  FileWatcherImpl *pFVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  bool *pbVar6;
  DirWatcherGeneric *this_00;
  mapped_type *ppDVar7;
  string *this_01;
  allocator local_191;
  string dir;
  string link;
  string local_150;
  string local_130;
  string curPath;
  string local_f0;
  string local_d0;
  string parentPath;
  FileInfo fi;
  string local_48;
  
  FileSystem::dirRemoveSlashAtEnd(newdir);
  std::__cxx11::string::string((string *)&local_48,(string *)newdir);
  FileSystem::fileNameFromPath(&fi.Filepath,&local_48);
  std::__cxx11::string::operator=((string *)newdir,(string *)&fi);
  std::__cxx11::string::~string((string *)&fi);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&parentPath,(string *)&this->DirSnap);
  FileSystem::dirAddSlashAtEnd(&parentPath);
  std::operator+(&dir,&parentPath,newdir);
  FileSystem::dirAddSlashAtEnd(&dir);
  FileInfo::FileInfo(&fi,&dir);
  bVar3 = FileInfo::isDirectory(&fi);
  if (bVar3) {
    bVar3 = FileInfo::isReadable(&fi);
    if (bVar3) {
      bVar3 = FileSystem::isRemoteFS(&dir);
      if (!bVar3) {
        curPath._M_dataplus._M_p = (pointer)&curPath.field_2;
        curPath._M_string_length = 0;
        curPath.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string((string *)&local_d0,(string *)&dir);
        FileSystem::getLinkRealPath(&link,&local_d0,&curPath);
        std::__cxx11::string::~string((string *)&local_d0);
        bVar3 = std::operator!=("",&link);
        pWVar1 = this->Watch;
        if (bVar3) {
          pbVar6 = FileWatcher::followSymlinks(pWVar1->WatcherImpl->mFileWatcher);
          bVar3 = *pbVar6;
          pFVar2 = this->Watch->WatcherImpl;
          iVar5 = (*pFVar2->_vptr_FileWatcherImpl[10])(pFVar2,&link);
          if ((char)iVar5 == '\0') {
            pWVar1 = this->Watch;
            std::__cxx11::string::string((string *)&local_130,(string *)&link);
            bVar4 = WatcherGeneric::pathInWatches(pWVar1,&local_130);
            if (bVar4) {
              this_01 = &local_130;
              goto LAB_0011f378;
            }
            pFVar2 = this->Watch->WatcherImpl;
            iVar5 = (*pFVar2->_vptr_FileWatcherImpl[9])(pFVar2,&curPath,&link);
            std::__cxx11::string::~string((string *)&local_130);
            if ((char)iVar5 != '\0') {
              std::__cxx11::string::_M_assign((string *)&dir);
              if (bVar3 != false) goto LAB_0011f3aa;
            }
          }
LAB_0011f482:
          this_00 = (DirWatcherGeneric *)0x0;
        }
        else {
          std::__cxx11::string::string((string *)&local_150,(string *)&dir);
          bVar3 = WatcherGeneric::pathInWatches(pWVar1,&local_150);
          if (bVar3) {
            this_01 = &local_150;
LAB_0011f378:
            std::__cxx11::string::~string((string *)this_01);
            goto LAB_0011f482;
          }
          pFVar2 = this->Watch->WatcherImpl;
          iVar5 = (*pFVar2->_vptr_FileWatcherImpl[10])(pFVar2,&dir);
          std::__cxx11::string::~string((string *)&local_150);
          if ((char)iVar5 != '\0') goto LAB_0011f482;
LAB_0011f3aa:
          std::__cxx11::string::string((string *)&local_f0,"",&local_191);
          handleAction(this,newdir,1,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          this_00 = (DirWatcherGeneric *)operator_new(0xc0);
          DirWatcherGeneric(this_00,this,this->Watch,&dir,this->Recursive,false);
          addChilds(this_00,true);
          watch(this_00,false);
          ppDVar7 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
                    ::operator[](&this->Directories,newdir);
          *ppDVar7 = this_00;
        }
        std::__cxx11::string::~string((string *)&link);
        std::__cxx11::string::~string((string *)&curPath);
        goto LAB_0011f25c;
      }
    }
  }
  this_00 = (DirWatcherGeneric *)0x0;
LAB_0011f25c:
  std::__cxx11::string::~string((string *)&fi);
  std::__cxx11::string::~string((string *)&dir);
  std::__cxx11::string::~string((string *)&parentPath);
  return this_00;
}

Assistant:

DirWatcherGeneric* DirWatcherGeneric::createDirectory( std::string newdir ) {
	FileSystem::dirRemoveSlashAtEnd( newdir );
	newdir = FileSystem::fileNameFromPath( newdir );

	DirWatcherGeneric* dw = NULL;

	/// Check if the directory is a symbolic link
	std::string parentPath( DirSnap.DirectoryInfo.Filepath );
	FileSystem::dirAddSlashAtEnd( parentPath );
	std::string dir( parentPath + newdir );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() || !fi.isReadable() || FileSystem::isRemoteFS( dir ) ) {
		return NULL;
	}

	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );
	bool skip = false;

	if ( "" != link ) {
		/// Avoid adding symlinks directories if it's now enabled
		if ( !Watch->WatcherImpl->mFileWatcher->followSymlinks() ) {
			skip = true;
		}

		/// If it's a symlink check if the realpath exists as a watcher, or
		/// if the path is outside the current dir
		if ( Watch->WatcherImpl->pathInWatches( link ) || Watch->pathInWatches( link ) ||
			 !Watch->WatcherImpl->linkAllowed( curPath, link ) ) {
			skip = true;
		} else {
			dir = link;
		}
	} else {
		if ( Watch->pathInWatches( dir ) || Watch->WatcherImpl->pathInWatches( dir ) ) {
			skip = true;
		}
	}

	if ( !skip ) {
		handleAction( newdir, Actions::Add );

		/// Creates the new directory watcher of the subfolder and check for new files
		dw = new DirWatcherGeneric( this, Watch, dir, Recursive );

		dw->addChilds();

		dw->watch();

		/// Add it to the list of directories
		Directories[newdir] = dw;
	}

	return dw;
}